

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

path * __thiscall boost::filesystem::path::filename(path *__return_storage_ptr__,path *this)

{
  bool bVar1;
  size_type sVar2;
  long lVar3;
  value_type *pvVar4;
  path *p;
  size_type pos;
  path *this_local;
  
  sVar2 = std::__cxx11::string::size();
  sVar2 = anon_unknown.dwarf_f716::filename_pos(&this->m_pathname,sVar2);
  lVar3 = std::__cxx11::string::size();
  if ((lVar3 != 0) && (sVar2 != 0)) {
    pvVar4 = (value_type *)std::__cxx11::string::operator[]((ulong)this);
    bVar1 = anon_unknown.dwarf_f716::is_separator(*pvVar4);
    if ((bVar1) &&
       (bVar1 = anon_unknown.dwarf_f716::is_root_separator(&this->m_pathname,sVar2), !bVar1)) {
      p = detail::dot_path();
      path(__return_storage_ptr__,p);
      return __return_storage_ptr__;
    }
  }
  lVar3 = std::__cxx11::string::c_str();
  path(__return_storage_ptr__,(value_type *)(lVar3 + sVar2));
  return __return_storage_ptr__;
}

Assistant:

path path::filename() const
  {
    size_type pos(filename_pos(m_pathname, m_pathname.size()));
    return (m_pathname.size()
              && pos
              && is_separator(m_pathname[pos])
              && !is_root_separator(m_pathname, pos))
      ? detail::dot_path()
      : path(m_pathname.c_str() + pos);
  }